

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O3

Promise<kj::Maybe<capnp::MessageReaderAndFds>_> __thiscall
capnp::WebSocketMessageStream::tryReadMessage
          (WebSocketMessageStream *this,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  void *pvVar3;
  _func_int **pp_Var4;
  undefined4 in_R9D;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  
  pp_Var4 = options._8_8_;
  (**(code **)(**(long **)(fdSpace.ptr + 2) + 0x30))
            (&local_58,*(long **)(fdSpace.ptr + 2),(long)pp_Var4 * 8,options.traversalLimitInWords);
  OVar2.ptr = local_58.ptr;
  pPVar1 = ((local_58.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_58.ptr - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)
               ::$_0::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_006d2080;
    *(_func_int ***)((long)pvVar3 + 0x3f0) = pp_Var4;
    *(undefined4 *)((long)pvVar3 + 0x3f8) = in_R9D;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    ((local_58.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_58.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               tryReadMessage(kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)
               ::$_0::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_006d2080;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var4;
    *(undefined4 *)&OVar2.ptr[-1].super_PromiseArenaMember.arena = in_R9D;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,&local_50,&local_48);
  OVar2.ptr = local_50.ptr;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_58.ptr;
  if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> WebSocketMessageStream::tryReadMessage(
    kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  return socket.receive(options.traversalLimitInWords * sizeof(word))
      .then([options](auto msg) -> kj::Promise<kj::Maybe<MessageReaderAndFds>> {
    KJ_SWITCH_ONEOF(msg) {
        KJ_CASE_ONEOF(closeMsg, kj::WebSocket::Close) {
          return kj::Maybe<MessageReaderAndFds>();
        }
        KJ_CASE_ONEOF(str, kj::String) {
          KJ_FAIL_REQUIRE(
              "Unexpected websocket text message; expected only binary messages.");
          break;
        }
        KJ_CASE_ONEOF(bytes, kj::Array<byte>) {
          kj::Own<capnp::MessageReader> reader;
          size_t sizeInWords = bytes.size() / sizeof(word);
          if (reinterpret_cast<uintptr_t>(bytes.begin()) % alignof(word) == 0) {
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(
                  reinterpret_cast<word *>(bytes.begin()),
                  sizeInWords
                ),
                options).attach(kj::mv(bytes));
          } else {
            // The array is misaligned, so we need to copy it.
            auto words = kj::heapArray<word>(sizeInWords);

            // Note: can't just use bytes.size(), since the the target buffer may
            // be shorter due to integer division.
            memcpy(words.begin(), bytes.begin(), sizeInWords * sizeof(word));
            reader = kj::heap<FlatArrayMessageReader>(
                kj::arrayPtr(words.begin(), sizeInWords),
                options).attach(kj::mv(words));
          }
          return kj::Maybe<MessageReaderAndFds>(MessageReaderAndFds {
            kj::mv(reader),
            nullptr
          });
        }
      }
      KJ_UNREACHABLE;
    });
}